

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

void test_qpixl_frqi_util_gray_permutation<float>(void)

{
  allocator<float> *paVar1;
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  initializer_list<float> __l_01;
  initializer_list<float> __l_02;
  initializer_list<float> __l_03;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  char *pcVar5;
  AssertHelper local_9e0;
  Message local_9d8;
  undefined1 local_9d0 [8];
  AssertionResult gtest_ar_61;
  Message local_9b8;
  undefined1 local_9b0 [8];
  AssertionResult gtest_ar_60;
  Message local_998;
  undefined1 local_990 [8];
  AssertionResult gtest_ar_59;
  Message local_978;
  undefined1 local_970 [8];
  AssertionResult gtest_ar_58;
  Message local_958;
  undefined1 local_950 [8];
  AssertionResult gtest_ar_57;
  Message local_938;
  undefined1 local_930 [8];
  AssertionResult gtest_ar_56;
  Message local_918;
  undefined1 local_910 [8];
  AssertionResult gtest_ar_55;
  Message local_8f8;
  undefined1 local_8f0 [8];
  AssertionResult gtest_ar_54;
  Message local_8d8;
  undefined1 local_8d0 [8];
  AssertionResult gtest_ar_53;
  Message local_8b8;
  undefined1 local_8b0 [8];
  AssertionResult gtest_ar_52;
  Message local_898;
  undefined1 local_890 [8];
  AssertionResult gtest_ar_51;
  Message local_878;
  undefined1 local_870 [8];
  AssertionResult gtest_ar_50;
  Message local_858;
  undefined1 local_850 [8];
  AssertionResult gtest_ar_49;
  Message local_838;
  undefined1 local_830 [8];
  AssertionResult gtest_ar_48;
  Message local_818;
  undefined1 local_810 [8];
  AssertionResult gtest_ar_47;
  Message local_7f8;
  undefined1 local_7f0 [8];
  AssertionResult gtest_ar_46;
  Message local_7d8;
  undefined1 local_7d0 [8];
  AssertionResult gtest_ar_45;
  Message local_7b8;
  undefined1 local_7b0 [8];
  AssertionResult gtest_ar_44;
  Message local_798;
  undefined1 local_790 [8];
  AssertionResult gtest_ar_43;
  Message local_778;
  undefined1 local_770 [8];
  AssertionResult gtest_ar_42;
  Message local_758;
  undefined1 local_750 [8];
  AssertionResult gtest_ar_41;
  Message local_738;
  undefined1 local_730 [8];
  AssertionResult gtest_ar_40;
  Message local_718;
  undefined1 local_710 [8];
  AssertionResult gtest_ar_39;
  Message local_6f8;
  undefined1 local_6f0 [8];
  AssertionResult gtest_ar_38;
  Message local_6d8;
  undefined1 local_6d0 [8];
  AssertionResult gtest_ar_37;
  Message local_6b8;
  undefined1 local_6b0 [8];
  AssertionResult gtest_ar_36;
  Message local_698;
  undefined1 local_690 [8];
  AssertionResult gtest_ar_35;
  Message local_678;
  undefined1 local_670 [8];
  AssertionResult gtest_ar_34;
  Message local_658;
  undefined1 local_650 [8];
  AssertionResult gtest_ar_33;
  Message local_638;
  undefined1 local_630 [8];
  AssertionResult gtest_ar_32;
  Message local_618;
  undefined1 local_610 [8];
  AssertionResult gtest_ar_31;
  Message local_5f8;
  undefined1 local_5f0 [8];
  AssertionResult gtest_ar_30;
  undefined1 local_5d8 [8];
  vector<float,_std::allocator<float>_> e_out;
  float local_5b8 [16];
  iterator local_578;
  size_type local_570;
  undefined1 local_568 [8];
  vector<float,_std::allocator<float>_> e;
  Message local_548;
  undefined1 local_540 [8];
  AssertionResult gtest_ar_29;
  Message local_528;
  undefined1 local_520 [8];
  AssertionResult gtest_ar_28;
  Message local_508;
  undefined1 local_500 [8];
  AssertionResult gtest_ar_27;
  Message local_4e8;
  undefined1 local_4e0 [8];
  AssertionResult gtest_ar_26;
  Message local_4c8;
  undefined1 local_4c0 [8];
  AssertionResult gtest_ar_25;
  Message local_4a8;
  undefined1 local_4a0 [8];
  AssertionResult gtest_ar_24;
  Message local_488;
  undefined1 local_480 [8];
  AssertionResult gtest_ar_23;
  Message local_468;
  undefined1 local_460 [8];
  AssertionResult gtest_ar_22;
  Message local_448;
  undefined1 local_440 [8];
  AssertionResult gtest_ar_21;
  Message local_428;
  undefined1 local_420 [8];
  AssertionResult gtest_ar_20;
  Message local_408;
  undefined1 local_400 [8];
  AssertionResult gtest_ar_19;
  Message local_3e8;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar_18;
  Message local_3c8;
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar_17;
  Message local_3a8;
  undefined1 local_3a0 [8];
  AssertionResult gtest_ar_16;
  Message local_388;
  undefined1 local_380 [8];
  AssertionResult gtest_ar_15;
  Message local_368;
  undefined1 local_360 [8];
  AssertionResult gtest_ar_14;
  undefined1 local_348 [8];
  vector<float,_std::allocator<float>_> d_out;
  float local_328 [8];
  iterator local_308;
  size_type local_300;
  undefined1 local_2f8 [8];
  vector<float,_std::allocator<float>_> d;
  Message local_2d8;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_13;
  Message local_2b8;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_12;
  Message local_298;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_11;
  Message local_278;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_10;
  Message local_258;
  undefined1 local_250 [8];
  AssertionResult gtest_ar_9;
  Message local_238;
  undefined1 local_230 [8];
  AssertionResult gtest_ar_8;
  Message local_218;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_7;
  Message local_1f8;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_6;
  undefined1 local_1d8 [8];
  vector<float,_std::allocator<float>_> c_out;
  float local_1b8 [4];
  iterator local_1a8;
  size_type local_1a0;
  undefined1 local_198 [8];
  vector<float,_std::allocator<float>_> c;
  Message local_178;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_5;
  Message local_158;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_4;
  Message local_138;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_3;
  Message local_118;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_2;
  undefined1 local_f8 [8];
  vector<float,_std::allocator<float>_> b_out;
  float local_d8 [2];
  iterator local_d0;
  size_type local_c8;
  undefined1 local_c0 [8];
  vector<float,_std::allocator<float>_> b;
  Message local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_1;
  Message local_80;
  undefined1 local_78 [8];
  AssertionResult gtest_ar;
  undefined1 local_60 [8];
  vector<float,_std::allocator<float>_> a_out;
  allocator<float> local_35;
  float local_34;
  iterator local_30;
  size_type local_28;
  undefined1 local_20 [8];
  vector<float,_std::allocator<float>_> a;
  
  local_34 = 1.0;
  local_30 = &local_34;
  local_28 = 1;
  std::allocator<float>::allocator(&local_35);
  __l_03._M_len = local_28;
  __l_03._M_array = local_30;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_20,__l_03,&local_35);
  std::allocator<float>::~allocator(&local_35);
  paVar1 = (allocator<float> *)
           ((long)&gtest_ar.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7);
  std::allocator<float>::allocator(paVar1);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_60,1,paVar1);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  qpixl::frqi::grayPermutation<std::vector<float,std::allocator<float>>>
            ((vector<float,_std::allocator<float>_> *)local_20,
             (vector<float,_std::allocator<float>_> *)local_60);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_20,0);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_60,0);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_78,"a[0]","a_out[0]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar2) {
    testing::Message::Message(&local_80);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x6a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  qpixl::frqi::grayPermutation<std::vector<float,std::allocator<float>>>
            ((vector<float,_std::allocator<float>_> *)local_20);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_20,0);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_60,0);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_98,"a[0]","a_out[0]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar2) {
    testing::Message::Message(&local_a0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &b.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x6d,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &b.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage,&local_a0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &b.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  local_d8[0] = 1.0;
  local_d8[1] = 2.0;
  local_d0 = local_d8;
  local_c8 = 2;
  paVar1 = (allocator<float> *)
           ((long)&b_out.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<float>::allocator(paVar1);
  __l_02._M_len = local_c8;
  __l_02._M_array = local_d0;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_c0,__l_02,paVar1);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&b_out.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  paVar1 = (allocator<float> *)
           ((long)&gtest_ar_2.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7);
  std::allocator<float>::allocator(paVar1);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_f8,2,paVar1);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&gtest_ar_2.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  qpixl::frqi::grayPermutation<std::vector<float,std::allocator<float>>>
            ((vector<float,_std::allocator<float>_> *)local_c0,
             (vector<float,_std::allocator<float>_> *)local_f8);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_c0,0);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_f8,0);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_110,"b[0]","b_out[0]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar2) {
    testing::Message::Message(&local_118);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x76,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_c0,1);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_f8,1);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_130,"b[1]","b_out[1]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar2) {
    testing::Message::Message(&local_138);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x77,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  qpixl::frqi::grayPermutation<std::vector<float,std::allocator<float>>>
            ((vector<float,_std::allocator<float>_> *)local_c0);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_c0,0);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_f8,0);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_150,"b[0]","b_out[0]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar2) {
    testing::Message::Message(&local_158);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x7a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_c0,1);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_f8,1);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_170,"b[1]","b_out[1]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar2) {
    testing::Message::Message(&local_178);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &c.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x7b,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &c.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage,&local_178);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &c.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  local_1b8[0] = 1.0;
  local_1b8[1] = 2.0;
  local_1b8[2] = 3.0;
  local_1b8[3] = 4.0;
  local_1a8 = local_1b8;
  local_1a0 = 4;
  paVar1 = (allocator<float> *)
           ((long)&c_out.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<float>::allocator(paVar1);
  __l_01._M_len = local_1a0;
  __l_01._M_array = local_1a8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_198,__l_01,paVar1);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&c_out.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  paVar1 = (allocator<float> *)
           ((long)&gtest_ar_6.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7);
  std::allocator<float>::allocator(paVar1);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_1d8,4,paVar1);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&gtest_ar_6.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  qpixl::frqi::grayPermutation<std::vector<float,std::allocator<float>>>
            ((vector<float,_std::allocator<float>_> *)local_198,
             (vector<float,_std::allocator<float>_> *)local_1d8);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_198,0);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_1d8,0);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_1f0,"c[0]","c_out[0]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar2) {
    testing::Message::Message(&local_1f8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x84,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_198,1);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_1d8,1);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_210,"c[1]","c_out[1]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar2) {
    testing::Message::Message(&local_218);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x85,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_198,2);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_1d8,3);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_230,"c[2]","c_out[3]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar2) {
    testing::Message::Message(&local_238);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_230);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x86,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_198,3);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_1d8,2);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_250,"c[3]","c_out[2]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
  if (!bVar2) {
    testing::Message::Message(&local_258);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x87,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  qpixl::frqi::grayPermutation<std::vector<float,std::allocator<float>>>
            ((vector<float,_std::allocator<float>_> *)local_198);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_198,0);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_1d8,0);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_270,"c[0]","c_out[0]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar2) {
    testing::Message::Message(&local_278);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x8a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_278);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_278);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_198,1);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_1d8,1);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_290,"c[1]","c_out[1]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
  if (!bVar2) {
    testing::Message::Message(&local_298);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_290);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x8b,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_198,2);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_1d8,2);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_2b0,"c[2]","c_out[2]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
  if (!bVar2) {
    testing::Message::Message(&local_2b8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x8c,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_198,3);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_1d8,3);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_2d0,"c[3]","c_out[3]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar2) {
    testing::Message::Message(&local_2d8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &d.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x8d,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &d.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &d.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
    testing::Message::~Message(&local_2d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  local_328[4] = 5.0;
  local_328[5] = 6.0;
  local_328[6] = 7.0;
  local_328[7] = 8.0;
  local_328[0] = 1.0;
  local_328[1] = 2.0;
  local_328[2] = 3.0;
  local_328[3] = 4.0;
  local_308 = local_328;
  local_300 = 8;
  paVar1 = (allocator<float> *)
           ((long)&d_out.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<float>::allocator(paVar1);
  __l_00._M_len = local_300;
  __l_00._M_array = local_308;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_2f8,__l_00,paVar1);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&d_out.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  paVar1 = (allocator<float> *)
           ((long)&gtest_ar_14.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7);
  std::allocator<float>::allocator(paVar1);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_348,8,paVar1);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&gtest_ar_14.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  qpixl::frqi::grayPermutation<std::vector<float,std::allocator<float>>>
            ((vector<float,_std::allocator<float>_> *)local_2f8,
             (vector<float,_std::allocator<float>_> *)local_348);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_2f8,0);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_348,0);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_360,"d[0]","d_out[0]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
  if (!bVar2) {
    testing::Message::Message(&local_368);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_360);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x96,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_368);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_368);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_2f8,1);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_348,1);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_380,"d[1]","d_out[1]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
  if (!bVar2) {
    testing::Message::Message(&local_388);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_380);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x97,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_388);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_2f8,2);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_348,3);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_3a0,"d[2]","d_out[3]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a0);
  if (!bVar2) {
    testing::Message::Message(&local_3a8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_3a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x98,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_3a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_3a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a0);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_2f8,3);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_348,2);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_3c0,"d[3]","d_out[2]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c0);
  if (!bVar2) {
    testing::Message::Message(&local_3c8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_3c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x99,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_3c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c0);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_2f8,4);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_348,7);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_3e0,"d[4]","d_out[7]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
  if (!bVar2) {
    testing::Message::Message(&local_3e8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_3e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x9a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_3e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_3e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_2f8,5);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_348,6);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_400,"d[5]","d_out[6]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_400);
  if (!bVar2) {
    testing::Message::Message(&local_408);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_400);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x9b,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_408);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_408);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_400);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_2f8,6);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_348,4);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_420,"d[6]","d_out[4]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
  if (!bVar2) {
    testing::Message::Message(&local_428);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_420);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x9c,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_428);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_428);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_420);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_2f8,7);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_348,5);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_440,"d[7]","d_out[5]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_440);
  if (!bVar2) {
    testing::Message::Message(&local_448);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_440);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x9d,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_448);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(&local_448);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_440);
  qpixl::frqi::grayPermutation<std::vector<float,std::allocator<float>>>
            ((vector<float,_std::allocator<float>_> *)local_2f8);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_2f8,0);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_348,0);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_460,"d[0]","d_out[0]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_460);
  if (!bVar2) {
    testing::Message::Message(&local_468);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_460);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xa0,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_468);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_460);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_2f8,1);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_348,1);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_480,"d[1]","d_out[1]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_480);
  if (!bVar2) {
    testing::Message::Message(&local_488);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_480);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xa1,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,&local_488);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
    testing::Message::~Message(&local_488);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_480);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_2f8,2);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_348,2);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_4a0,"d[2]","d_out[2]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a0);
  if (!bVar2) {
    testing::Message::Message(&local_4a8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_4a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xa2,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,&local_4a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(&local_4a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a0);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_2f8,3);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_348,3);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_4c0,"d[3]","d_out[3]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c0);
  if (!bVar2) {
    testing::Message::Message(&local_4c8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_4c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_26.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xa3,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26.message_,&local_4c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26.message_);
    testing::Message::~Message(&local_4c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c0);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_2f8,4);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_348,4);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_4e0,"d[4]","d_out[4]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e0);
  if (!bVar2) {
    testing::Message::Message(&local_4e8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_4e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xa4,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_27.message_,&local_4e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
    testing::Message::~Message(&local_4e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e0);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_2f8,5);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_348,5);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_500,"d[5]","d_out[5]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
  if (!bVar2) {
    testing::Message::Message(&local_508);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_500);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_28.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xa5,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_28.message_,&local_508);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_28.message_);
    testing::Message::~Message(&local_508);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_2f8,6);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_348,6);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_520,"d[6]","d_out[6]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_520);
  if (!bVar2) {
    testing::Message::Message(&local_528);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_520);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xa6,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29.message_,&local_528);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
    testing::Message::~Message(&local_528);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_520);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_2f8,7);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_348,7);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_540,"d[7]","d_out[7]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_540);
  if (!bVar2) {
    testing::Message::Message(&local_548);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_540);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &e.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xa7,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &e.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage,&local_548);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &e.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
    testing::Message::~Message(&local_548);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_540);
  local_5b8[0xc] = 13.0;
  local_5b8[0xd] = 14.0;
  local_5b8[0xe] = 15.0;
  local_5b8[0xf] = 16.0;
  local_5b8[8] = 9.0;
  local_5b8[9] = 10.0;
  local_5b8[10] = 11.0;
  local_5b8[0xb] = 12.0;
  local_5b8[4] = 5.0;
  local_5b8[5] = 6.0;
  local_5b8[6] = 7.0;
  local_5b8[7] = 8.0;
  local_5b8[0] = 1.0;
  local_5b8[1] = 2.0;
  local_5b8[2] = 3.0;
  local_5b8[3] = 4.0;
  local_578 = local_5b8;
  local_570 = 0x10;
  paVar1 = (allocator<float> *)
           ((long)&e_out.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<float>::allocator(paVar1);
  __l._M_len = local_570;
  __l._M_array = local_578;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_568,__l,paVar1);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&e_out.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  paVar1 = (allocator<float> *)
           ((long)&gtest_ar_30.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7);
  std::allocator<float>::allocator(paVar1);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_5d8,0x10,paVar1);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&gtest_ar_30.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  qpixl::frqi::grayPermutation<std::vector<float,std::allocator<float>>>
            ((vector<float,_std::allocator<float>_> *)local_568,
             (vector<float,_std::allocator<float>_> *)local_5d8);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_568,0);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_5d8,0);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_5f0,"e[ 0]","e_out[ 0]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f0);
  if (!bVar2) {
    testing::Message::Message(&local_5f8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_5f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_31.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xb1,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_31.message_,&local_5f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_31.message_);
    testing::Message::~Message(&local_5f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f0);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_568,1);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_5d8,1);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_610,"e[ 1]","e_out[ 1]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_610);
  if (!bVar2) {
    testing::Message::Message(&local_618);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_610);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_32.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xb2,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_32.message_,&local_618);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_32.message_);
    testing::Message::~Message(&local_618);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_610);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_568,2);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_5d8,3);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_630,"e[ 2]","e_out[ 3]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_630);
  if (!bVar2) {
    testing::Message::Message(&local_638);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_630);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_33.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xb3,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_33.message_,&local_638);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_33.message_);
    testing::Message::~Message(&local_638);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_630);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_568,3);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_5d8,2);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_650,"e[ 3]","e_out[ 2]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_650);
  if (!bVar2) {
    testing::Message::Message(&local_658);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_650);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_34.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xb4,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_34.message_,&local_658);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_34.message_);
    testing::Message::~Message(&local_658);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_650);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_568,4);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_5d8,7);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_670,"e[ 4]","e_out[ 7]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_670);
  if (!bVar2) {
    testing::Message::Message(&local_678);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_670);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_35.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xb5,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_35.message_,&local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_35.message_);
    testing::Message::~Message(&local_678);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_670);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_568,5);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_5d8,6);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_690,"e[ 5]","e_out[ 6]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_690);
  if (!bVar2) {
    testing::Message::Message(&local_698);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_690);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_36.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xb6,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_36.message_,&local_698);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_36.message_);
    testing::Message::~Message(&local_698);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_690);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_568,6);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_5d8,4);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_6b0,"e[ 6]","e_out[ 4]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b0);
  if (!bVar2) {
    testing::Message::Message(&local_6b8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_6b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_37.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xb7,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_37.message_,&local_6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_37.message_);
    testing::Message::~Message(&local_6b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b0);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_568,7);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_5d8,5);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_6d0,"e[ 7]","e_out[ 5]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6d0);
  if (!bVar2) {
    testing::Message::Message(&local_6d8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_6d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_38.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xb8,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_38.message_,&local_6d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_38.message_);
    testing::Message::~Message(&local_6d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6d0);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_568,8);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_5d8,0xf);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_6f0,"e[ 8]","e_out[15]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6f0);
  if (!bVar2) {
    testing::Message::Message(&local_6f8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_6f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_39.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xb9,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_39.message_,&local_6f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_39.message_);
    testing::Message::~Message(&local_6f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6f0);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_568,9);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_5d8,0xe);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_710,"e[ 9]","e_out[14]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_710);
  if (!bVar2) {
    testing::Message::Message(&local_718);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_710);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_40.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xba,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_40.message_,&local_718);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_40.message_);
    testing::Message::~Message(&local_718);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_710);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_568,10);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_5d8,0xc);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_730,"e[10]","e_out[12]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_730);
  if (!bVar2) {
    testing::Message::Message(&local_738);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_730);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_41.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xbb,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_41.message_,&local_738);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_41.message_);
    testing::Message::~Message(&local_738);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_730);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_568,0xb);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_5d8,0xd);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_750,"e[11]","e_out[13]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_750);
  if (!bVar2) {
    testing::Message::Message(&local_758);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_750);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_42.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xbc,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_42.message_,&local_758);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_42.message_);
    testing::Message::~Message(&local_758);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_750);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_568,0xc);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_5d8,8);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_770,"e[12]","e_out[ 8]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_770);
  if (!bVar2) {
    testing::Message::Message(&local_778);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_770);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_43.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xbd,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_43.message_,&local_778);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_43.message_);
    testing::Message::~Message(&local_778);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_770);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_568,0xd);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_5d8,9);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_790,"e[13]","e_out[ 9]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_790);
  if (!bVar2) {
    testing::Message::Message(&local_798);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_790);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_44.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xbe,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_44.message_,&local_798);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_44.message_);
    testing::Message::~Message(&local_798);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_790);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_568,0xe);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_5d8,0xb);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_7b0,"e[14]","e_out[11]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7b0);
  if (!bVar2) {
    testing::Message::Message(&local_7b8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_7b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_45.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xbf,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_45.message_,&local_7b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_45.message_);
    testing::Message::~Message(&local_7b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7b0);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_568,0xf);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_5d8,10);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_7d0,"e[15]","e_out[10]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7d0);
  if (!bVar2) {
    testing::Message::Message(&local_7d8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_7d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_46.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xc0,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_46.message_,&local_7d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_46.message_);
    testing::Message::~Message(&local_7d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7d0);
  qpixl::frqi::grayPermutation<std::vector<float,std::allocator<float>>>
            ((vector<float,_std::allocator<float>_> *)local_568);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_568,0);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_5d8,0);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_7f0,"e[ 0]","e_out[ 0]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7f0);
  if (!bVar2) {
    testing::Message::Message(&local_7f8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_7f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_47.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xc3,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_47.message_,&local_7f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_47.message_);
    testing::Message::~Message(&local_7f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7f0);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_568,1);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_5d8,1);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_810,"e[ 1]","e_out[ 1]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_810);
  if (!bVar2) {
    testing::Message::Message(&local_818);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_810);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_48.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xc4,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_48.message_,&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_48.message_);
    testing::Message::~Message(&local_818);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_810);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_568,2);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_5d8,2);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_830,"e[ 2]","e_out[ 2]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_830);
  if (!bVar2) {
    testing::Message::Message(&local_838);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_830);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_49.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xc5,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_49.message_,&local_838);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_49.message_);
    testing::Message::~Message(&local_838);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_830);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_568,3);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_5d8,3);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_850,"e[ 3]","e_out[ 3]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_850);
  if (!bVar2) {
    testing::Message::Message(&local_858);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_850);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_50.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xc6,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_50.message_,&local_858);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_50.message_);
    testing::Message::~Message(&local_858);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_850);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_568,4);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_5d8,4);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_870,"e[ 4]","e_out[ 4]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_870);
  if (!bVar2) {
    testing::Message::Message(&local_878);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_870);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_51.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,199,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_51.message_,&local_878);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_51.message_);
    testing::Message::~Message(&local_878);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_870);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_568,5);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_5d8,5);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_890,"e[ 5]","e_out[ 5]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_890);
  if (!bVar2) {
    testing::Message::Message(&local_898);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_890);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_52.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,200,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_52.message_,&local_898);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_52.message_);
    testing::Message::~Message(&local_898);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_890);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_568,6);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_5d8,6);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_8b0,"e[ 6]","e_out[ 6]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8b0);
  if (!bVar2) {
    testing::Message::Message(&local_8b8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_8b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_53.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xc9,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_53.message_,&local_8b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_53.message_);
    testing::Message::~Message(&local_8b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8b0);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_568,7);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_5d8,7);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_8d0,"e[ 7]","e_out[ 7]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8d0);
  if (!bVar2) {
    testing::Message::Message(&local_8d8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_8d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_54.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xca,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_54.message_,&local_8d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_54.message_);
    testing::Message::~Message(&local_8d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8d0);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_568,8);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_5d8,8);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_8f0,"e[ 8]","e_out[ 8]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8f0);
  if (!bVar2) {
    testing::Message::Message(&local_8f8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_8f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_55.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xcb,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_55.message_,&local_8f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_55.message_);
    testing::Message::~Message(&local_8f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8f0);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_568,9);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_5d8,9);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_910,"e[ 9]","e_out[ 9]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_910);
  if (!bVar2) {
    testing::Message::Message(&local_918);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_910);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_56.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xcc,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_56.message_,&local_918);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_56.message_);
    testing::Message::~Message(&local_918);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_910);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_568,10);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_5d8,10);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_930,"e[10]","e_out[10]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_930);
  if (!bVar2) {
    testing::Message::Message(&local_938);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_930);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_57.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xcd,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_57.message_,&local_938);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_57.message_);
    testing::Message::~Message(&local_938);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_930);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_568,0xb);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_5d8,0xb);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_950,"e[11]","e_out[11]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_950);
  if (!bVar2) {
    testing::Message::Message(&local_958);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_950);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_58.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xce,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_58.message_,&local_958);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_58.message_);
    testing::Message::~Message(&local_958);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_950);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_568,0xc);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_5d8,0xc);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_970,"e[12]","e_out[12]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_970);
  if (!bVar2) {
    testing::Message::Message(&local_978);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_970);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_59.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xcf,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_59.message_,&local_978);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_59.message_);
    testing::Message::~Message(&local_978);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_970);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_568,0xd);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_5d8,0xd);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_990,"e[13]","e_out[13]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_990);
  if (!bVar2) {
    testing::Message::Message(&local_998);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_990);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_60.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xd0,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_60.message_,&local_998);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_60.message_);
    testing::Message::~Message(&local_998);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_990);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_568,0xe);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_5d8,0xe);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_9b0,"e[14]","e_out[14]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9b0);
  if (!bVar2) {
    testing::Message::Message(&local_9b8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_9b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_61.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xd1,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_61.message_,&local_9b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_61.message_);
    testing::Message::~Message(&local_9b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9b0);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_568,0xf);
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_5d8,0xf);
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_9d0,"e[15]","e_out[15]",pvVar3,pvVar4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9d0);
  if (!bVar2) {
    testing::Message::Message(&local_9d8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_9d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_9e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0xd2,pcVar5);
    testing::internal::AssertHelper::operator=(&local_9e0,&local_9d8);
    testing::internal::AssertHelper::~AssertHelper(&local_9e0);
    testing::Message::~Message(&local_9d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9d0);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_5d8);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_568);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_348);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_2f8);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_1d8);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_198);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_f8);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_c0);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_60);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_20);
  return;
}

Assistant:

void test_qpixl_frqi_util_gray_permutation() {
  std::vector< R > a = { 1 } ;
  std::vector< R > a_out( 1 ) ;

  {
    // with copy
    qpixl::frqi::grayPermutation( a, a_out );
    EXPECT_EQ( a[0] , a_out[0] );
    // in-place
    qpixl::frqi::grayPermutation( a );
    EXPECT_EQ( a[0] , a_out[0] );
  }
  
  std::vector< R > b = { 1 , 2 };
  std::vector< R > b_out( 2 ) ;

  {
    // with copy
    qpixl::frqi::grayPermutation( b, b_out );
    EXPECT_EQ( b[0] , b_out[0] );
    EXPECT_EQ( b[1] , b_out[1] );
    // in-place
    qpixl::frqi::grayPermutation( b );
    EXPECT_EQ( b[0] , b_out[0] );
    EXPECT_EQ( b[1] , b_out[1] );
  } 

  std::vector< R > c = { 1 , 2 , 3 , 4 };
  std::vector< R > c_out( 4 ) ;

  {
    // with copy
    qpixl::frqi::grayPermutation( c, c_out );
    EXPECT_EQ( c[0] , c_out[0] );
    EXPECT_EQ( c[1] , c_out[1] );
    EXPECT_EQ( c[2] , c_out[3] );
    EXPECT_EQ( c[3] , c_out[2] );
    // in-place
    qpixl::frqi::grayPermutation( c );
    EXPECT_EQ( c[0] , c_out[0] );
    EXPECT_EQ( c[1] , c_out[1] );
    EXPECT_EQ( c[2] , c_out[2] );
    EXPECT_EQ( c[3] , c_out[3] );
  } 

  std::vector< R > d = { 1 , 2 , 3 , 4 , 5 , 6 , 7 , 8 };
  std::vector< R > d_out( 8 ) ;

  {
    // with copy
    qpixl::frqi::grayPermutation( d, d_out );
    EXPECT_EQ( d[0] , d_out[0] );
    EXPECT_EQ( d[1] , d_out[1] );
    EXPECT_EQ( d[2] , d_out[3] );
    EXPECT_EQ( d[3] , d_out[2] );
    EXPECT_EQ( d[4] , d_out[7] );
    EXPECT_EQ( d[5] , d_out[6] );
    EXPECT_EQ( d[6] , d_out[4] );
    EXPECT_EQ( d[7] , d_out[5] );
    // in-place
    qpixl::frqi::grayPermutation( d );
    EXPECT_EQ( d[0] , d_out[0] );
    EXPECT_EQ( d[1] , d_out[1] );
    EXPECT_EQ( d[2] , d_out[2] );
    EXPECT_EQ( d[3] , d_out[3] );
    EXPECT_EQ( d[4] , d_out[4] );
    EXPECT_EQ( d[5] , d_out[5] );
    EXPECT_EQ( d[6] , d_out[6] );
    EXPECT_EQ( d[7] , d_out[7] );
  }

  std::vector< R > e = { 1 , 2 , 3 , 4 , 5 , 6 , 7 , 8 , 9 , 
                         10 , 11 , 12 , 13 , 14 , 15 , 16 };
  std::vector< R > e_out( 16 ) ;

  {
    // with copy
    qpixl::frqi::grayPermutation( e, e_out );
    EXPECT_EQ( e[ 0] , e_out[ 0] );
    EXPECT_EQ( e[ 1] , e_out[ 1] );
    EXPECT_EQ( e[ 2] , e_out[ 3] );
    EXPECT_EQ( e[ 3] , e_out[ 2] );
    EXPECT_EQ( e[ 4] , e_out[ 7] );
    EXPECT_EQ( e[ 5] , e_out[ 6] );
    EXPECT_EQ( e[ 6] , e_out[ 4] );
    EXPECT_EQ( e[ 7] , e_out[ 5] );
    EXPECT_EQ( e[ 8] , e_out[15] );
    EXPECT_EQ( e[ 9] , e_out[14] );
    EXPECT_EQ( e[10] , e_out[12] );
    EXPECT_EQ( e[11] , e_out[13] );
    EXPECT_EQ( e[12] , e_out[ 8] );
    EXPECT_EQ( e[13] , e_out[ 9] );
    EXPECT_EQ( e[14] , e_out[11] );
    EXPECT_EQ( e[15] , e_out[10] );
    // in-place
    qpixl::frqi::grayPermutation( e );
    EXPECT_EQ( e[ 0] , e_out[ 0] );
    EXPECT_EQ( e[ 1] , e_out[ 1] );
    EXPECT_EQ( e[ 2] , e_out[ 2] );
    EXPECT_EQ( e[ 3] , e_out[ 3] );
    EXPECT_EQ( e[ 4] , e_out[ 4] );
    EXPECT_EQ( e[ 5] , e_out[ 5] );
    EXPECT_EQ( e[ 6] , e_out[ 6] );
    EXPECT_EQ( e[ 7] , e_out[ 7] );
    EXPECT_EQ( e[ 8] , e_out[ 8] );
    EXPECT_EQ( e[ 9] , e_out[ 9] );
    EXPECT_EQ( e[10] , e_out[10] );
    EXPECT_EQ( e[11] , e_out[11] );
    EXPECT_EQ( e[12] , e_out[12] );
    EXPECT_EQ( e[13] , e_out[13] );
    EXPECT_EQ( e[14] , e_out[14] );
    EXPECT_EQ( e[15] , e_out[15] );
  }
  
}